

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O0

Address __thiscall
ParamListStandard::assignAddress
          (ParamListStandard *this,Datatype *tp,vector<int,_std::allocator<int>_> *status)

{
  bool bVar1;
  type_metatype tVar2;
  type_metatype tVar3;
  int4 iVar4;
  int iVar5;
  reference this_00;
  reference pvVar6;
  _List_node_base *in_RCX;
  uintb extraout_RDX;
  uintb extraout_RDX_00;
  uintb uVar7;
  uintb extraout_RDX_01;
  uintb extraout_RDX_02;
  Address AVar8;
  int local_54;
  int4 j;
  int4 maxgrp;
  int4 grp;
  ParamEntry *curEntry;
  _List_node_base *local_38;
  _List_const_iterator<ParamEntry> local_30;
  const_iterator iter;
  vector<int,_std::allocator<int>_> *status_local;
  Datatype *tp_local;
  ParamListStandard *this_local;
  Address *res;
  
  iter._M_node = in_RCX;
  std::_List_const_iterator<ParamEntry>::_List_const_iterator(&local_30);
  local_38 = (_List_node_base *)
             std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::begin
                       ((list<ParamEntry,_std::allocator<ParamEntry>_> *)&tp->field_0x20);
  local_30._M_node = local_38;
  do {
    curEntry = (ParamEntry *)
               std::__cxx11::list<ParamEntry,_std::allocator<ParamEntry>_>::end
                         ((list<ParamEntry,_std::allocator<ParamEntry>_> *)&tp->field_0x20);
    bVar1 = std::operator!=(&local_30,(_Self *)&curEntry);
    if (!bVar1) {
      Address::Address((Address *)this);
      uVar7 = extraout_RDX_02;
LAB_00507853:
      AVar8.offset = uVar7;
      AVar8.base = (AddrSpace *)this;
      return AVar8;
    }
    this_00 = std::_List_const_iterator<ParamEntry>::operator*(&local_30);
    local_54 = ParamEntry::getGroup(this_00);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)iter._M_node,(long)local_54);
    if (-1 < *pvVar6) {
      tVar2 = ParamEntry::getType(this_00);
      if (tVar2 != TYPE_UNKNOWN) {
        tVar2 = Datatype::getMetatype((Datatype *)status);
        tVar3 = ParamEntry::getType(this_00);
        if (tVar2 != tVar3) goto LAB_0050783c;
      }
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)iter._M_node,(long)local_54);
      Datatype::getSize((Datatype *)status);
      ParamEntry::getAddrBySlot((ParamEntry *)this,(int4 *)this_00,(int4)pvVar6);
      bVar1 = Address::isInvalid((Address *)this);
      if (!bVar1) {
        bVar1 = ParamEntry::isExclusion(this_00);
        uVar7 = extraout_RDX;
        if (bVar1) {
          iVar4 = ParamEntry::getGroupSize(this_00);
          iVar5 = local_54 + iVar4;
          uVar7 = extraout_RDX_00;
          for (; local_54 < iVar5; local_54 = local_54 + 1) {
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)iter._M_node,(long)local_54);
            *pvVar6 = -1;
            uVar7 = extraout_RDX_01;
          }
        }
        goto LAB_00507853;
      }
    }
LAB_0050783c:
    std::_List_const_iterator<ParamEntry>::operator++(&local_30);
  } while( true );
}

Assistant:

Address ParamListStandard::assignAddress(const Datatype *tp,vector<int4> &status) const

{
  list<ParamEntry>::const_iterator iter;
  for(iter=entry.begin();iter!=entry.end();++iter) {
    const ParamEntry &curEntry( *iter );
    int4 grp = curEntry.getGroup();
    if (status[grp]<0) continue;
    if ((curEntry.getType() != TYPE_UNKNOWN)&&
	tp->getMetatype() != curEntry.getType())
      continue;			// Wrong type

    Address res = curEntry.getAddrBySlot(status[grp],tp->getSize());
    if (res.isInvalid()) continue; // If -tp- doesn't fit an invalid address is returned
    if (curEntry.isExclusion()) {
      int4 maxgrp = grp + curEntry.getGroupSize();
      for(int4 j=grp;j<maxgrp;++j) // For an exclusion entry
	status[j] = -1;		// some number of groups are taken up
    }
    return res;
  }
  return Address();		// Return invalid address to indicated we could not assign anything
}